

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

pair_type __thiscall
booster::locale::gnu_gettext::mo_message<char>::get_string
          (mo_message<char> *this,int domain_id,char_type *context,char_type *in_id)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  __shared_ptr *this_00;
  long lVar4;
  long lVar5;
  int in_ESI;
  long in_RDI;
  pair_type pVar6;
  pair_type pVar7;
  const_iterator p;
  catalog_type *cat;
  key_type key;
  pair_type null_pair;
  map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffee8;
  message_key<char> *in_stack_fffffffffffffef0;
  char_type *in_stack_fffffffffffffef8;
  char *local_e0;
  char *local_d8;
  undefined4 local_cc;
  _Self local_c8 [3];
  undefined1 local_b0 [96];
  char *local_50;
  char *local_48;
  pair<const_char_*,_const_char_*> local_40 [2];
  int local_1c;
  pair_type local_10;
  
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_1c = in_ESI;
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            (local_40,&local_48,&local_50);
  if ((-1 < local_1c) &&
     (uVar2 = (ulong)local_1c,
     sVar3 = std::
             vector<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::size((vector<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)(in_RDI + 0x10)), uVar2 < sVar3)) {
    this_00 = (__shared_ptr *)
              std::
              vector<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
              ::operator[]((vector<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
                            *)(in_RDI + 0x28),(long)local_1c);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (!bVar1) {
      message_key<char>::message_key
                ((message_key<char> *)(local_b0 + 0x10),in_stack_fffffffffffffef8,
                 (char_type *)in_stack_fffffffffffffef0);
      local_b0._8_8_ =
           std::
           vector<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[]((vector<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)(in_RDI + 0x10),(long)local_1c);
      local_b0._0_8_ =
           std::
           map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(in_stack_fffffffffffffee8,(key_type *)0x249657);
      local_c8[0]._M_node =
           (_Base_ptr)
           std::
           map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_stack_fffffffffffffee8);
      bVar1 = std::operator==((_Self *)local_b0,local_c8);
      if (bVar1) {
        local_10.second = local_40[0].second;
        local_10.first = local_40[0].first;
      }
      else {
        in_stack_fffffffffffffef0 = (message_key<char> *)local_b0;
        std::
        _Rb_tree_const_iterator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x2496e5);
        local_d8 = (char *)std::__cxx11::string::data();
        std::
        _Rb_tree_const_iterator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x249700);
        lVar4 = std::__cxx11::string::data();
        std::
        _Rb_tree_const_iterator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x24971b);
        lVar5 = std::__cxx11::string::size();
        local_e0 = (char *)(lVar4 + lVar5);
        std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
                  (&local_10,&local_d8,&local_e0);
      }
      local_cc = 1;
      message_key<char>::~message_key(in_stack_fffffffffffffef0);
      return local_10;
    }
    std::
    vector<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
    ::operator[]((vector<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
                  *)(in_RDI + 0x28),(long)local_1c);
    std::
    __shared_ptr_access<booster::locale::gnu_gettext::mo_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<booster::locale::gnu_gettext::mo_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffef0);
    pVar6 = mo_file_use_traits<char>::use
                      ((mo_file *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                       (char *)0x2495f9);
    pVar7.first = pVar6.first;
    pVar7.second = pVar6.second;
    return pVar7;
  }
  local_10.second = local_40[0].second;
  local_10.first = local_40[0].first;
  return local_10;
}

Assistant:

pair_type get_string(int domain_id,char_type const *context,char_type const *in_id) const
                {
                    pair_type null_pair((CharType const *)0,(CharType const *)0);
                    if(domain_id < 0 || size_t(domain_id) >= catalogs_.size())
                        return null_pair;
                    if(mo_file_use_traits<char_type>::in_use && mo_catalogs_[domain_id]) {
                        return mo_file_use_traits<char_type>::use(*mo_catalogs_[domain_id],context,in_id);
                    }
                    else {
                        key_type key(context,in_id);
                        catalog_type const &cat = catalogs_[domain_id];
                        typename catalog_type::const_iterator p = cat.find(key);
                        if(p==cat.end()) {
                            return null_pair;
                        }
                        return pair_type(p->second.data(),p->second.data()+p->second.size());
                    }
                }